

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# forwarder.c
# Opt level: O0

ndn_bitset_t
fwd_multicast(uint8_t *packet,size_t length,ndn_bitset_t out_faces,ndn_table_id_t in_face)

{
  size_t sVar1;
  ndn_bitset_t local_38;
  ndn_bitset_t ret;
  ndn_face_intf_t *face;
  ndn_table_id_t id;
  ndn_bitset_t nStack_20;
  ndn_table_id_t in_face_local;
  ndn_bitset_t out_faces_local;
  size_t length_local;
  uint8_t *packet_local;
  
  local_38 = 0;
  nStack_20 = out_faces;
  out_faces_local = length;
  length_local = (size_t)packet;
  while (nStack_20 != 0) {
    sVar1 = bitset_pop_least(&stack0xffffffffffffffe0);
    if (((ndn_table_id_t)sVar1 != in_face) &&
       (forwarder.facetab[(sVar1 & 0xffff) + 1] != (ndn_face_table_t)0x0)) {
      ndn_face_send((ndn_face_intf_t *)forwarder.facetab[(sVar1 & 0xffff) + 1],
                    (uint8_t *)length_local,(uint32_t)out_faces_local);
      local_38 = bitset_set(local_38,sVar1 & 0xffff);
    }
  }
  return local_38;
}

Assistant:

static ndn_bitset_t
fwd_multicast(uint8_t* packet,
              size_t length,
              ndn_bitset_t out_faces,
              ndn_table_id_t in_face)
{
  ndn_table_id_t id;
  ndn_face_intf_t* face;
  ndn_bitset_t ret = 0;

  while(out_faces != 0){
    id = bitset_pop_least(&out_faces);
    face = forwarder.facetab->slots[id];
    if(id != in_face && face != NULL){
      ndn_face_send(face, packet, length);
      ret = bitset_set(ret, id);
    }
  }
  return ret;
}